

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Timer.cpp
# Opt level: O0

void __thiscall Timer::restart(Timer *this,int interval,int flags,shared_ptr<EventLoop> *l)

{
  bool bVar1;
  int iVar2;
  element_type *peVar3;
  Timer *local_90;
  code *local_88;
  undefined8 local_80;
  type local_78;
  function<void_(int)> local_60;
  undefined1 local_30 [8];
  SharedPtr loop;
  shared_ptr<EventLoop> *l_local;
  int flags_local;
  int interval_local;
  Timer *this_local;
  
  loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)l;
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)l);
  if (bVar1) {
    std::shared_ptr<EventLoop>::shared_ptr
              ((shared_ptr<EventLoop> *)local_30,
               (shared_ptr<EventLoop> *)
               loop.super___shared_ptr<EventLoop,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
  }
  else {
    EventLoop::eventLoop();
  }
  bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_30);
  if (bVar1) {
    if (this->timerId != 0) {
      peVar3 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_30);
      EventLoop::unregisterTimer(peVar3,this->timerId);
    }
    peVar3 = std::__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<EventLoop,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                        local_30);
    local_88 = timerFired;
    local_80 = 0;
    local_90 = this;
    std::bind<void(Timer::*)(int),Timer*,std::_Placeholder<1>const&>
              (&local_78,(offset_in_Timer_to_subr *)&local_88,&local_90,
               (_Placeholder<1> *)&std::placeholders::_1);
    std::function<void(int)>::
    function<std::_Bind<void(Timer::*(Timer*,std::_Placeholder<1>))(int)>,void>
              ((function<void(int)> *)&local_60,&local_78);
    iVar2 = EventLoop::registerTimer(peVar3,&local_60,interval,flags);
    this->timerId = iVar2;
    std::function<void_(int)>::~function(&local_60);
  }
  std::shared_ptr<EventLoop>::~shared_ptr((shared_ptr<EventLoop> *)local_30);
  return;
}

Assistant:

void Timer::restart(int interval, int flags, const std::shared_ptr<EventLoop> &l)
{
    EventLoop::SharedPtr loop = l ? l : EventLoop::eventLoop();
    if (loop) {
        // ### this is a bit inefficient, should revisit
        if (timerId)
            loop->unregisterTimer(timerId);
        timerId = loop->registerTimer(std::bind(&Timer::timerFired, this, std::placeholders::_1),
                                      interval, flags);
    }
}